

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huffman_utils.c
# Opt level: O1

HTreeGroup * VP8LHtreeGroupsNew(int num_htree_groups)

{
  HTreeGroup *pHVar1;
  
  pHVar1 = (HTreeGroup *)WebPSafeMalloc((long)num_htree_groups,0x238);
  return pHVar1;
}

Assistant:

HTreeGroup* VP8LHtreeGroupsNew(int num_htree_groups) {
  HTreeGroup* const htree_groups =
      (HTreeGroup*)WebPSafeMalloc(num_htree_groups, sizeof(*htree_groups));
  if (htree_groups == NULL) {
    return NULL;
  }
  assert(num_htree_groups <= MAX_HTREE_GROUPS);
  return htree_groups;
}